

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<const_kj::FsNode,_std::nullptr_t> __thiscall
kj::anon_unknown_59::AppendableFileImpl::cloneFsNode(AppendableFileImpl *this)

{
  _func_int **pp_Var1;
  FsNode *extraout_RDX;
  long in_RSI;
  Own<const_kj::FsNode,_std::nullptr_t> OVar2;
  _func_int *local_28;
  _func_int *local_20;
  
  (**(code **)(**(long **)(in_RSI + 0x18) + 0x28))(&local_28);
  pp_Var1 = (_func_int **)operator_new(0x20);
  if (local_20 == (_func_int *)0x0) {
    local_28 = (_func_int *)0x0;
  }
  *pp_Var1 = (_func_int *)&PTR_getFd_00261ce0;
  pp_Var1[1] = (_func_int *)&PTR__AppendableFileImpl_00261d38;
  pp_Var1[2] = local_28;
  pp_Var1[3] = local_20;
  (this->super_AppendableFile).super_FsNode._vptr_FsNode =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::AppendableFileImpl>::instance;
  (this->super_AppendableFile).super_OutputStream._vptr_OutputStream = pp_Var1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const FsNode> cloneFsNode() const override {
    return heap<AppendableFileImpl>(file->clone());
  }